

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::MultisampleTextureUsageCase::iterate
          (MultisampleTextureUsageCase *this)

{
  bool bVar1;
  deUint32 seed;
  TestLog *log;
  float local_100;
  deUint32 local_ec;
  deUint32 local_e8;
  deUint32 local_e4;
  deUint32 local_dc;
  deUint32 local_d8;
  deUint32 local_d4;
  float preparedValue;
  float rawValue;
  Random rnd;
  float maxValue;
  float minValue;
  Surface result;
  string local_70;
  allocator<char> local_39;
  string local_38;
  ScopedLogSection local_18;
  ScopedLogSection section;
  MultisampleTextureUsageCase *this_local;
  
  section.m_log = (TestLog *)this;
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Sample",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Render to texture and sample texture",
             (allocator<char> *)((long)&result.m_pixels.m_cap + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_18,log,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&result.m_pixels.m_cap + 7));
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  tcu::Surface::Surface((Surface *)&maxValue,0x100,0x100);
  if (((this->m_isColorFormat & 1U) == 0) && ((this->m_isDepthFormat & 1U) == 0)) {
    if ((this->m_isSignedFormat & 1U) == 0) {
      local_dc = 0;
      if ((this->m_isUnsignedFormat & 1U) == 0) {
        local_dc = 0x3f800000;
      }
      local_d8 = local_dc;
    }
    else {
      local_d8 = 0xc2c80000;
    }
    local_d4 = local_d8;
  }
  else {
    local_d4 = 0;
  }
  rnd.m_rnd.w = local_d4;
  if (((this->m_isColorFormat & 1U) == 0) && ((this->m_isDepthFormat & 1U) == 0)) {
    if ((this->m_isSignedFormat & 1U) == 0) {
      local_ec = 0x43480000;
      if ((this->m_isUnsignedFormat & 1U) == 0) {
        local_ec = 0xbf800000;
      }
      local_e8 = local_ec;
    }
    else {
      local_e8 = 0x42c80000;
    }
    local_e4 = local_e8;
  }
  else {
    local_e4 = 0x3f800000;
  }
  rnd.m_rnd.z = local_e4;
  seed = deUint32Hash(this->m_type);
  de::Random::Random((Random *)&preparedValue,seed);
  local_100 = de::Random::getFloat((Random *)&preparedValue,(float)rnd.m_rnd.w,(float)rnd.m_rnd.z);
  if (((this->m_isSignedFormat & 1U) != 0) || ((this->m_isUnsignedFormat & 1U) != 0)) {
    local_100 = ::deFloatFloor(local_100);
  }
  renderToTexture(this,local_100);
  sampleTexture(this,(Surface *)&maxValue,local_100);
  bVar1 = verifyImage(this,(Surface *)&maxValue);
  if (bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image verification failed");
  }
  de::Random::~Random((Random *)&preparedValue);
  tcu::Surface::~Surface((Surface *)&maxValue);
  tcu::ScopedLogSection::~ScopedLogSection(&local_18);
  return STOP;
}

Assistant:

MultisampleTextureUsageCase::IterateResult MultisampleTextureUsageCase::iterate (void)
{
	const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Sample", "Render to texture and sample texture");
	tcu::Surface				result			(s_textureSize, s_textureSize);
	const float					minValue		= (m_isColorFormat || m_isDepthFormat) ? (0.0f) : (m_isSignedFormat) ? (-100.0f) : (m_isUnsignedFormat) ? (0.0f)	: ( 1.0f);
	const float					maxValue		= (m_isColorFormat || m_isDepthFormat) ? (1.0f) : (m_isSignedFormat) ? ( 100.0f) : (m_isUnsignedFormat) ? (200.0f)	: (-1.0f);
	de::Random					rnd				(deUint32Hash((deUint32)m_type));
	const float					rawValue		= rnd.getFloat(minValue, maxValue);
	const float					preparedValue	= (m_isSignedFormat || m_isUnsignedFormat) ? (deFloatFloor(rawValue)) : (rawValue);

	// draw to fbo with a random value

	renderToTexture(preparedValue);

	// draw from texture to front buffer

	sampleTexture(result, preparedValue);

	// result is ok?

	if (verifyImage(result))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");

	return STOP;
}